

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

const_iterator * __thiscall
QMultiHash<int,_int>::constFindImpl<int>(QMultiHash<int,_int> *this,int *key)

{
  long lVar1;
  piter it_00;
  bool bVar2;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  Bucket it;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_stack_ffffffffffffffa8;
  const_iterator *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = isEmpty((QMultiHash<int,_int> *)in_RSI);
  if (bVar2) {
    end((QMultiHash<int,_int> *)in_RDI);
  }
  else {
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::findBucket<int>(in_RSI,(int *)this_00);
    bVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Bucket::isUnused
                      ((Bucket *)0x72bc01);
    if (bVar2) {
      constEnd((QMultiHash<int,_int> *)in_RDI);
    }
    else {
      iVar3 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Bucket::toIterator
                        ((Bucket *)in_RDI,in_stack_ffffffffffffffa8);
      it_00.bucket = (size_t)iVar3.d;
      it_00.d = in_RSI;
      const_iterator::const_iterator(this_00,it_00,(Chain **)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }